

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void nni_sha1_pad(nni_sha1_ctx *ctx)

{
  int iVar1;
  nni_sha1_ctx *ctx_local;
  
  if (ctx->idx < 0x38) {
    iVar1 = ctx->idx;
    ctx->idx = iVar1 + 1;
    ctx->blk[iVar1] = 0x80;
    while (ctx->idx < 0x38) {
      iVar1 = ctx->idx;
      ctx->idx = iVar1 + 1;
      ctx->blk[iVar1] = '\0';
    }
  }
  else {
    iVar1 = ctx->idx;
    ctx->idx = iVar1 + 1;
    ctx->blk[iVar1] = 0x80;
    while (ctx->idx < 0x40) {
      iVar1 = ctx->idx;
      ctx->idx = iVar1 + 1;
      ctx->blk[iVar1] = '\0';
    }
    nni_sha1_process(ctx);
    while (ctx->idx < 0x38) {
      iVar1 = ctx->idx;
      ctx->idx = iVar1 + 1;
      ctx->blk[iVar1] = '\0';
    }
  }
  ctx->blk[0x38] = (uint8_t)(ctx->len >> 0x38);
  ctx->blk[0x39] = (uint8_t)(ctx->len >> 0x30);
  ctx->blk[0x3a] = (uint8_t)(ctx->len >> 0x28);
  ctx->blk[0x3b] = (uint8_t)(ctx->len >> 0x20);
  ctx->blk[0x3c] = (uint8_t)(ctx->len >> 0x18);
  ctx->blk[0x3d] = (uint8_t)(ctx->len >> 0x10);
  ctx->blk[0x3e] = (uint8_t)(ctx->len >> 8);
  ctx->blk[0x3f] = (uint8_t)ctx->len;
  nni_sha1_process(ctx);
  return;
}

Assistant:

void
nni_sha1_pad(nni_sha1_ctx *ctx)
{
	// Check to see if the current message block is too small to hold
	// the initial padding bits and length.  If so, we will pad the
	// block, process it, and then continue padding into a second block.
	if (ctx->idx > 55) {
		ctx->blk[ctx->idx++] = 0x80;
		while (ctx->idx < 64) {
			ctx->blk[ctx->idx++] = 0;
		}

		nni_sha1_process(ctx);

		while (ctx->idx < 56) {
			ctx->blk[ctx->idx++] = 0;
		}
	} else {
		ctx->blk[ctx->idx++] = 0x80;
		while (ctx->idx < 56) {
			ctx->blk[ctx->idx++] = 0;
		}
	}

	// Store the message length as the last 8 octets (big endian)
	ctx->blk[56] = (ctx->len >> 56) & 0xff;
	ctx->blk[57] = (ctx->len >> 48) & 0xff;
	ctx->blk[58] = (ctx->len >> 40) & 0xff;
	ctx->blk[59] = (ctx->len >> 32) & 0xff;
	ctx->blk[60] = (ctx->len >> 24) & 0xff;
	ctx->blk[61] = (ctx->len >> 16) & 0xff;
	ctx->blk[62] = (ctx->len >> 8) & 0xff;
	ctx->blk[63] = (ctx->len) & 0xff;

	nni_sha1_process(ctx);
}